

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O3

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>_>
         *this)

{
  EVP_PKEY_CTX *ctx;
  CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_>
  obj;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_d0 [3];
  SmallVectorBase<(anonymous_namespace)::Constructable> local_70 [3];
  
  ::(anonymous_namespace)::Constructable::numConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numDestructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  local_d0[0].data_ = (pointer)local_d0[0].firstElement;
  local_d0[0].len = 0;
  ctx = (EVP_PKEY_CTX *)&DAT_00000009;
  local_d0[0].cap = 9;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 9;
  (*(code *)this->m_testAsMethod)(local_d0[0].firstElement + *(long *)&this->field_0x10 + -0x18);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(local_70,ctx);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(local_d0,ctx);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }